

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# progress.c
# Opt level: O3

void Curl_pgrsTime(Curl_easy *data,timerid timer)

{
  undefined8 uVar1;
  undefined4 uVar2;
  undefined8 uVar3;
  undefined4 uVar4;
  time_t tVar5;
  timediff_t tVar6;
  long lVar7;
  int iVar8;
  time_t *ptVar9;
  curltime cVar10;
  curltime newer;
  curltime older;
  curltime older_00;
  
  cVar10 = Curl_now();
  tVar5 = cVar10.tv_sec;
  iVar8 = cVar10.tv_usec;
  switch(timer) {
  case TIMER_STARTOP:
    (data->progress).t_startop.tv_sec = tVar5;
    (data->progress).t_startop.tv_usec = iVar8;
    return;
  case TIMER_STARTSINGLE:
    (data->progress).t_startsingle.tv_sec = tVar5;
    (data->progress).t_startsingle.tv_usec = iVar8;
    (data->progress).is_t_startransfer_set = false;
    return;
  case TIMER_NAMELOOKUP:
    ptVar9 = &(data->progress).t_nslookup;
    break;
  case TIMER_CONNECT:
    ptVar9 = &(data->progress).t_connect;
    break;
  case TIMER_APPCONNECT:
    ptVar9 = &(data->progress).t_appconnect;
    break;
  case TIMER_PRETRANSFER:
    ptVar9 = &(data->progress).t_pretransfer;
    break;
  case TIMER_STARTTRANSFER:
    if ((data->progress).is_t_startransfer_set != false) {
      return;
    }
    ptVar9 = &(data->progress).t_starttransfer;
    (data->progress).is_t_startransfer_set = true;
    break;
  default:
    goto switchD_0010c575_caseD_8;
  case TIMER_STARTACCEPT:
    (data->progress).t_acceptdata.tv_sec = tVar5;
    (data->progress).t_acceptdata.tv_usec = iVar8;
    return;
  case TIMER_REDIRECT:
    uVar3 = (data->progress).start.tv_sec;
    uVar4 = (data->progress).start.tv_usec;
    older_00.tv_usec = uVar4;
    older_00.tv_sec = uVar3;
    cVar10._8_8_ = cVar10._8_8_ & 0xffffffff;
    cVar10.tv_sec = tVar5;
    older_00._12_4_ = 0;
    tVar6 = Curl_timediff_us(cVar10,older_00);
    (data->progress).t_redirect = tVar6;
    goto switchD_0010c575_caseD_8;
  }
  uVar1 = (data->progress).t_startsingle.tv_sec;
  uVar2 = (data->progress).t_startsingle.tv_usec;
  older.tv_usec = uVar2;
  older.tv_sec = uVar1;
  newer._8_8_ = cVar10._8_8_ & 0xffffffff;
  newer.tv_sec = tVar5;
  older._12_4_ = 0;
  tVar6 = Curl_timediff_us(newer,older);
  lVar7 = 1;
  if (1 < tVar6) {
    lVar7 = tVar6;
  }
  *ptVar9 = *ptVar9 + lVar7;
switchD_0010c575_caseD_8:
  return;
}

Assistant:

void Curl_pgrsTime(struct Curl_easy *data, timerid timer)
{
  struct curltime now = Curl_now();
  time_t *delta = NULL;

  switch(timer) {
  default:
  case TIMER_NONE:
    /* mistake filter */
    break;
  case TIMER_STARTOP:
    /* This is set at the start of a transfer */
    data->progress.t_startop = now;
    break;
  case TIMER_STARTSINGLE:
    /* This is set at the start of each single fetch */
    data->progress.t_startsingle = now;
    data->progress.is_t_startransfer_set = false;
    break;
  case TIMER_STARTACCEPT:
    data->progress.t_acceptdata = now;
    break;
  case TIMER_NAMELOOKUP:
    delta = &data->progress.t_nslookup;
    break;
  case TIMER_CONNECT:
    delta = &data->progress.t_connect;
    break;
  case TIMER_APPCONNECT:
    delta = &data->progress.t_appconnect;
    break;
  case TIMER_PRETRANSFER:
    delta = &data->progress.t_pretransfer;
    break;
  case TIMER_STARTTRANSFER:
    delta = &data->progress.t_starttransfer;
    /* prevent updating t_starttransfer unless:
     *   1) this is the first time we're setting t_starttransfer
     *   2) a redirect has occurred since the last time t_starttransfer was set
     * This prevents repeated invocations of the function from incorrectly
     * changing the t_starttransfer time.
     */
    if(data->progress.is_t_startransfer_set) {
      return;
    }
    else {
      data->progress.is_t_startransfer_set = true;
      break;
    }
  case TIMER_POSTRANSFER:
    /* this is the normal end-of-transfer thing */
    break;
  case TIMER_REDIRECT:
    data->progress.t_redirect = Curl_timediff_us(now, data->progress.start);
    break;
  }
  if(delta) {
    timediff_t us = Curl_timediff_us(now, data->progress.t_startsingle);
    if(us < 1)
      us = 1; /* make sure at least one microsecond passed */
    *delta += us;
  }
}